

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_kernel.cc
# Opt level: O1

void __thiscall
ipx::BasicLuKernel::_Factorize
          (BasicLuKernel *this,Int dim,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,double pivottol,
          bool strict_abs_pivottol,SparseMatrix *L,SparseMatrix *U,
          vector<int,_std::allocator<int>_> *rowperm,vector<int,_std::allocator<int>_> *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  pointer piVar1;
  iterator __position;
  uint uVar2;
  lu_int lVar3;
  logic_error *plVar4;
  code *pcVar5;
  undefined *puVar6;
  int local_9c;
  double local_98;
  BasicLuHelper lu;
  
  local_98 = pivottol;
  BasicLuHelper::BasicLuHelper(&lu,dim);
  lu.obj.xstore[6] = local_98;
  if (strict_abs_pivottol) {
    lu.obj.xstore[5] = 0.001;
    lu.obj.xstore[0xd] = 1.0;
  }
  uVar2 = basiclu_obj_factorize(&lu.obj,Bbegin,Bend,Bi,Bx);
  if (uVar2 == 0xfffffff7) {
    plVar4 = (logic_error *)__cxa_allocate_exception(8);
    *(code **)plVar4 = time;
    pcVar5 = std::bad_alloc::~bad_alloc;
    puVar6 = &std::bad_alloc::typeinfo;
  }
  else {
    if ((uVar2 & 0xfffffffd) == 0) {
      local_9c = (int)lu.obj.xstore[0x65];
      piVar1 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = piVar1;
      }
      if (local_9c < dim) {
        do {
          __position._M_current =
               (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)dependent_cols,__position,&local_9c);
          }
          else {
            *__position._M_current = local_9c;
            (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          local_9c = local_9c + 1;
        } while (local_9c < dim);
      }
      local_98 = (double)dim;
      SparseMatrix::resize(L,dim,dim,(int)(lu.obj.xstore[0x4c] + local_98));
      SparseMatrix::resize(U,dim,dim,(int)(local_98 + lu.obj.xstore[0x4d]));
      std::vector<int,_std::allocator<int>_>::resize(rowperm,(long)dim);
      std::vector<int,_std::allocator<int>_>::resize(colperm,(long)dim);
      lVar3 = basiclu_obj_get_factors
                        (&lu.obj,(rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start,
                         (colperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (L->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (L->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (L->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (U->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (U->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (U->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if (lVar3 == 0) {
        RemoveDiagonal(L,(double *)0x0);
        basiclu_obj_free(&lu.obj);
        return;
      }
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar4,"basiclu_obj_get_factors failed");
      __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar4,"basiclu_obj_factorize failed");
    pcVar5 = std::logic_error::~logic_error;
    puVar6 = &std::logic_error::typeinfo;
  }
  __cxa_throw(plVar4,puVar6,pcVar5);
}

Assistant:

void BasicLuKernel::_Factorize(Int dim, const Int* Bbegin, const Int* Bend,
                               const Int* Bi, const double* Bx, double pivottol,
                               bool strict_abs_pivottol,
                               SparseMatrix* L, SparseMatrix* U,
                               std::vector<Int>* rowperm,
                               std::vector<Int>* colperm,
                               std::vector<Int>* dependent_cols) {
    BasicLuHelper lu(dim);
    lu.obj.xstore[BASICLU_REL_PIVOT_TOLERANCE] = pivottol;
    if (strict_abs_pivottol) {
        lu.obj.xstore[BASICLU_ABS_PIVOT_TOLERANCE] = kLuDependencyTol;
        lu.obj.xstore[BASICLU_REMOVE_COLUMNS] = 1;
    }
    Int err = basiclu_obj_factorize(&lu.obj, Bbegin, Bend, Bi, Bx);
    if (err == BASICLU_ERROR_out_of_memory)
        throw std::bad_alloc();
    if (err != BASICLU_OK && err != BASICLU_WARNING_singular_matrix)
        throw std::logic_error("basiclu_obj_factorize failed");

    // Extract factors. Dependent columns are at the end of the BASICLU pivot
    // sequence.
    Int rank = lu.obj.xstore[BASICLU_RANK];
    dependent_cols->clear();
    for (Int k = rank; k < dim; k++)
        dependent_cols->push_back(k);
    L->resize(dim, dim, dim + lu.obj.xstore[BASICLU_LNZ]);
    U->resize(dim, dim, dim + lu.obj.xstore[BASICLU_UNZ]);
    rowperm->resize(dim);
    colperm->resize(dim);
    err = basiclu_obj_get_factors(&lu.obj, rowperm->data(), colperm->data(),
                                  L->colptr(), L->rowidx(), L->values(),
                                  U->colptr(), U->rowidx(), U->values());
    if (err != BASICLU_OK)
        throw std::logic_error("basiclu_obj_get_factors failed");

    // Remove unit diagonal from L.
    Int num_dropped = RemoveDiagonal(*L, nullptr);
    assert(num_dropped == dim);
    assert(L->entries() == lu.obj.xstore[BASICLU_LNZ]);
}